

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

Record * env_match(char *identifer,Environment *env)

{
  int iVar1;
  Record *pRVar2;
  
  do {
    if (env == (Environment *)0x0) {
      return (Record *)0x0;
    }
    for (pRVar2 = env->front; pRVar2 != (Record *)0x0; pRVar2 = pRVar2->next) {
      iVar1 = strcmp(pRVar2->name,identifer);
      if (iVar1 == 0) {
        return pRVar2;
      }
    }
    env = env->parent;
  } while( true );
}

Assistant:

static Record* env_match(char* identifer, Environment *env){
    if(env == NULL)
        return NULL;
    Record *bak = env->front;
    while(bak != NULL){
        if(strcmp(bak->name, identifer) == 0)
            return bak;
        bak = bak->next;
    }
    return env_match(identifer, env->parent);
}